

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O1

int decodeInstruction(InternalInstruction *insn,byteReader_t reader,void *readerArg,
                     uint64_t startLoc,DisassemblerMode mode)

{
  DisassemblerMode DVar1;
  VectorExtensionType VVar2;
  uint64_t uVar3;
  short sVar4;
  bool bVar5;
  uint8_t uVar6;
  byte bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint64_t uVar11;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  ulong uVar12;
  ushort uVar13;
  short sVar15;
  uint uVar16;
  uint8_t uVar17;
  uint64_t uVar18;
  ulong uVar19;
  ushort uVar20;
  byte bVar21;
  uint8_t uVar22;
  uint8_t *puVar23;
  reader_info *prVar24;
  bool bVar25;
  uint8_t byte;
  uint8_t nextByte;
  uint16_t instructionID;
  uint8_t byte1_3;
  uint8_t byte1;
  uint8_t byte1_1;
  uint8_t byte1_2;
  uint8_t byte2;
  uint16_t instructionIDWithOpsize;
  byte local_57;
  byte local_56;
  byte local_55;
  ushort local_54;
  byte local_52;
  byte local_51;
  byte local_50;
  byte local_4f;
  byte local_4e;
  byte local_4d;
  ushort local_4c;
  ushort local_4a;
  ulong local_48;
  _Bool *local_40;
  undefined8 local_38;
  ushort uVar14;
  
  insn->reader = reader;
  insn->readerArg = readerArg;
  insn->startLocation = startLoc;
  insn->readerCursor = startLoc;
  insn->mode = mode;
  local_57 = 0;
  local_40 = &insn->isPrefix26;
  bVar25 = true;
  local_48 = 0;
  local_38 = 0;
  do {
    if (insn->mode == MODE_64BIT) {
      iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_57,insn->readerCursor);
      if (iVar8 != 0) {
        return -1;
      }
      uVar11 = insn->readerCursor;
      uVar18 = uVar11 + 1;
      insn->readerCursor = uVar18;
      if ((local_57 & 0xf0) == 0x40) {
        prVar24 = (reader_info *)insn->readerArg;
        while( true ) {
          iVar8 = (*insn->reader)(prVar24,&local_57,uVar18);
          if (iVar8 != 0) {
            return -1;
          }
          if ((local_57 & 0xf0) != 0x40) break;
          iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_57,insn->readerCursor);
          if (iVar8 != 0) {
            return -1;
          }
          prVar24 = (reader_info *)insn->readerArg;
          uVar18 = insn->readerCursor + 1;
          insn->readerCursor = uVar18;
        }
        if ((((local_57 - 0x2e < 0x3a) &&
             ((0x3c0000000010101U >> ((ulong)(local_57 - 0x2e) & 0x3f) & 1) != 0)) ||
            ((local_57 - 0xf0 < 4 && (local_57 - 0xf0 != 1)))) || (local_57 == 0x26))
        goto LAB_001a410b;
        uVar11 = insn->readerCursor - 1;
      }
      insn->readerCursor = uVar11;
    }
LAB_001a410b:
    uVar18 = insn->readerCursor;
    iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_57,uVar18);
    if (iVar8 != 0) {
      return -1;
    }
    uVar3 = insn->readerCursor;
    uVar11 = uVar3 + 1;
    insn->readerCursor = uVar11;
    if ((uVar3 == insn->startLocation) && ((local_57 & 0xfe) == 0xf2)) {
      iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_55,uVar11);
      if (iVar8 != 0) {
        return -1;
      }
      if (((local_57 & 0xfe) == 0xf2) &&
         (((local_55 == 0xf0 || ((local_55 & 0xfe) == 0x86)) || ((local_55 & 0xf8) == 0x90)))) {
        insn->xAcquireRelease = true;
      }
      if (((local_57 == 0xf3) && (local_55 - 0x88 < 0x40)) &&
         ((0xc000000000000003U >> ((ulong)(local_55 - 0x88) & 0x3f) & 1) != 0)) {
        insn->xAcquireRelease = true;
      }
      if ((insn->mode == MODE_64BIT) && ((local_55 & 0xf0) == 0x40)) {
        iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_55,insn->readerCursor);
        if (iVar8 != 0) {
          return -1;
        }
        uVar11 = insn->readerCursor + 1;
        insn->readerCursor = uVar11;
        iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_55,uVar11);
        if (iVar8 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor - 1;
      }
    }
    bVar7 = local_57;
    if (local_57 < 0x3e) {
      if (local_57 == 0x26) {
        insn->segmentOverride = SEG_OVERRIDE_ES;
      }
      else if (local_57 == 0x2e) {
        insn->segmentOverride = SEG_OVERRIDE_CS;
      }
      else {
        if (local_57 != 0x36) goto LAB_001a42dd;
        insn->segmentOverride = SEG_OVERRIDE_SS;
      }
      goto LAB_001a431f;
    }
    switch(local_57) {
    case 100:
      insn->segmentOverride = SEG_OVERRIDE_FS;
      goto LAB_001a431f;
    case 0x65:
      insn->segmentOverride = SEG_OVERRIDE_GS;
LAB_001a431f:
      *(undefined2 *)(local_40 + 4) = 0;
      local_40[0] = false;
      local_40[1] = false;
      local_40[2] = false;
      local_40[3] = false;
      setPrefixPresent(insn,local_57,uVar18);
      insn->prefix1 = bVar7;
      break;
    case 0x66:
      setPrefixPresent(insn,local_57,uVar18);
      insn->prefix2 = bVar7;
      local_48 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      break;
    case 0x67:
      setPrefixPresent(insn,local_57,uVar18);
      insn->prefix3 = bVar7;
      local_38 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
      break;
    default:
      if ((local_57 - 0xf0 < 4) && (local_57 - 0xf0 != 1)) {
        insn->isPrefixf3 = false;
        insn->isPrefixf0 = false;
        insn->isPrefixf2 = false;
        setPrefixPresent(insn,local_57,uVar18);
        insn->prefix0 = bVar7;
      }
      else {
        if (local_57 == 0x3e) {
          insn->segmentOverride = SEG_OVERRIDE_DS;
          goto LAB_001a431f;
        }
LAB_001a42dd:
        bVar25 = false;
      }
    }
  } while (bVar25);
  insn->vectorExtensionType = TYPE_NO_VEX_XOP;
  if (bVar7 < 0xc4) {
    if (bVar7 == 0x62) {
      iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_51,insn->readerCursor);
      if (iVar8 != 0) {
        return -1;
      }
      uVar11 = insn->readerCursor;
      uVar18 = uVar11 + 1;
      insn->readerCursor = uVar18;
      if ((local_51 & 0xc) == 0 && (0xbf < local_51 || insn->mode == MODE_64BIT)) {
        iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_4d,uVar18);
        if (iVar8 != 0) {
          return -1;
        }
        if ((local_4d & 4) == 0) {
          uVar18 = insn->readerCursor;
          insn->readerCursor = uVar18 - 2;
          insn->necessaryPrefixLocation = uVar18 - 4;
        }
        else {
          insn->vectorExtensionType = TYPE_EVEX;
        }
        if (insn->vectorExtensionType == TYPE_EVEX) {
          insn->vectorExtensionPrefix[0] = local_57;
          insn->vectorExtensionPrefix[1] = local_51;
          iVar8 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 2,
                                  insn->readerCursor);
          if (iVar8 != 0) {
            return -1;
          }
          prVar24 = (reader_info *)insn->readerArg;
          uVar18 = insn->readerCursor + 1;
          insn->readerCursor = uVar18;
          puVar23 = insn->vectorExtensionPrefix + 3;
          goto LAB_001a4924;
        }
      }
      else {
        insn->readerCursor = uVar11 - 1;
      }
    }
    else {
      if (bVar7 == 0x8f) {
        iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_50,insn->readerCursor);
        if (iVar8 == 0) {
          if ((local_50 & 0x38) == 0) {
            uVar18 = insn->readerCursor;
            insn->readerCursor = uVar18 - 1;
            uVar18 = uVar18 - 2;
          }
          else {
            insn->vectorExtensionType = TYPE_XOP;
            uVar18 = insn->readerCursor - 1;
          }
          insn->necessaryPrefixLocation = uVar18;
          bVar25 = true;
          uVar12 = local_48;
          if (insn->vectorExtensionType != TYPE_XOP) goto LAB_001a43f0;
          insn->vectorExtensionPrefix[0] = local_57;
          iVar8 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 1,
                                  insn->readerCursor);
          if (iVar8 == 0) {
            uVar18 = insn->readerCursor + 1;
            insn->readerCursor = uVar18;
            puVar23 = insn->vectorExtensionPrefix + 2;
            iVar8 = (*insn->reader)((reader_info *)insn->readerArg,puVar23,uVar18);
            if (iVar8 == 0) {
              insn->readerCursor = insn->readerCursor + 1;
              if (insn->mode == MODE_64BIT) {
                bVar7 = (byte)~insn->vectorExtensionPrefix[1] >> 5 |
                        insn->vectorExtensionPrefix[2] >> 4 & 8;
                goto LAB_001a4a2b;
              }
              goto LAB_001a4a30;
            }
          }
        }
        goto LAB_001a43ee;
      }
LAB_001a43fe:
      if ((insn->mode == MODE_64BIT) && ((bVar7 & 0xf0) == 0x40)) {
        iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_52,insn->readerCursor);
        if (iVar8 != 0) {
          return -1;
        }
        while ((local_52 & 0xf0) == 0x40) {
          iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_57,insn->readerCursor);
          if (iVar8 != 0) {
            return -1;
          }
          uVar18 = insn->readerCursor + 1;
          insn->readerCursor = uVar18;
          iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_52,uVar18);
          if (iVar8 != 0) {
            return -1;
          }
        }
        insn->rexPrefix = local_57;
        uVar18 = insn->readerCursor;
      }
      else {
        uVar18 = insn->readerCursor;
        insn->readerCursor = uVar18 - 1;
      }
      insn->necessaryPrefixLocation = uVar18 - 2;
    }
  }
  else if (bVar7 == 0xc4) {
    iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_4e,insn->readerCursor);
    if (iVar8 != 0) {
      return -1;
    }
    if ((insn->mode == MODE_64BIT) || (0xbf < local_4e)) {
      insn->vectorExtensionType = TYPE_VEX_3B;
      uVar18 = insn->readerCursor - 1;
    }
    else {
      uVar18 = insn->readerCursor;
      insn->readerCursor = uVar18 - 1;
      uVar18 = uVar18 - 2;
    }
    insn->necessaryPrefixLocation = uVar18;
    if (insn->vectorExtensionType == TYPE_VEX_3B) {
      insn->vectorExtensionPrefix[0] = local_57;
      iVar8 = (*insn->reader)((reader_info *)insn->readerArg,insn->vectorExtensionPrefix + 1,
                              insn->readerCursor);
      if (iVar8 != 0) {
        return -1;
      }
      prVar24 = (reader_info *)insn->readerArg;
      uVar18 = insn->readerCursor + 1;
      insn->readerCursor = uVar18;
      puVar23 = insn->vectorExtensionPrefix + 2;
LAB_001a4924:
      iVar8 = (*insn->reader)(prVar24,puVar23,uVar18);
      if (iVar8 != 0) {
        return -1;
      }
      insn->readerCursor = insn->readerCursor + 1;
      if (insn->mode == MODE_64BIT) {
        insn->rexPrefix =
             (byte)~insn->vectorExtensionPrefix[1] >> 5 | insn->vectorExtensionPrefix[2] >> 4 & 8 |
             0x40;
      }
    }
  }
  else {
    if (bVar7 != 0xc5) goto LAB_001a43fe;
    iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_4f,insn->readerCursor);
    if (iVar8 == 0) {
      if ((insn->mode == MODE_64BIT) || (0xbf < local_4f)) {
        insn->vectorExtensionType = TYPE_VEX_2B;
      }
      else {
        insn->readerCursor = insn->readerCursor - 1;
      }
      bVar25 = true;
      uVar12 = local_48;
      if (insn->vectorExtensionType == TYPE_VEX_2B) {
        insn->vectorExtensionPrefix[0] = local_57;
        puVar23 = insn->vectorExtensionPrefix + 1;
        iVar8 = (*insn->reader)((reader_info *)insn->readerArg,puVar23,insn->readerCursor);
        if (iVar8 != 0) goto LAB_001a43ee;
        insn->readerCursor = insn->readerCursor + 1;
        if (insn->mode == MODE_64BIT) {
          bVar7 = (byte)~insn->vectorExtensionPrefix[1] >> 5 & 4;
LAB_001a4a2b:
          insn->rexPrefix = bVar7 | 0x40;
        }
LAB_001a4a30:
        bVar25 = true;
        uVar12 = 1;
        if ((*puVar23 & 3) != 1) {
          uVar12 = local_48 & 0xff;
        }
      }
    }
    else {
LAB_001a43ee:
      bVar25 = false;
      uVar12 = local_48;
    }
LAB_001a43f0:
    local_48 = uVar12;
    if (!bVar25) {
      return -1;
    }
  }
  DVar1 = insn->mode;
  bVar7 = (byte)local_48;
  bVar21 = (byte)local_38;
  if (DVar1 == MODE_64BIT) {
    if ((insn->rexPrefix & 8) != 0) {
      insn->registerSize = '\b';
      uVar22 = (~bVar21 & 1) * '\x04' + '\x04';
      uVar6 = '\x04';
      uVar17 = '\x04';
      goto LAB_001a4605;
    }
    uVar17 = (~bVar7 & 1) * '\x02' + '\x02';
    insn->registerSize = uVar17;
    insn->addressSize = (~bVar21 & 1) * '\x04' + '\x04';
    insn->displacementSize = uVar17;
    insn->immediateSize = uVar17;
    if (insn->rexPrefix == 0) {
      uVar17 = (~bVar7 & 1) * '\x04' + '\x04';
    }
LAB_001a4618:
    insn->immSize = uVar17;
  }
  else {
    if (DVar1 == MODE_32BIT) {
      uVar17 = (~bVar7 & 1) * '\x02' + '\x02';
      insn->registerSize = uVar17;
      bVar21 = ~bVar21;
LAB_001a45f8:
      uVar22 = (bVar21 & 1) * '\x02' + '\x02';
      uVar6 = uVar22;
LAB_001a4605:
      insn->addressSize = uVar22;
      insn->displacementSize = uVar6;
      insn->immediateSize = uVar17;
      goto LAB_001a4618;
    }
    if (DVar1 == MODE_16BIT) {
      uVar17 = (bVar7 & 1) * '\x02' + '\x02';
      insn->registerSize = uVar17;
      goto LAB_001a45f8;
    }
  }
  insn->opcodeType = ONEBYTE;
  switch(insn->vectorExtensionType) {
  case TYPE_VEX_2B:
switchD_001a4647_caseD_1:
    insn->twoByteEscape = '\x0f';
switchD_001a46cd_caseD_1:
    insn->opcodeType = TWOBYTE;
    break;
  case TYPE_VEX_3B:
    bVar7 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (bVar7 != 3) {
      if (bVar7 == 2) {
        insn->twoByteEscape = '\x0f';
        insn->threeByteEscape = '8';
        goto switchD_001a46cd_caseD_2;
      }
      if (bVar7 != 1) {
        return -1;
      }
      goto switchD_001a4647_caseD_1;
    }
    insn->twoByteEscape = '\x0f';
    insn->threeByteEscape = ':';
switchD_001a46cd_caseD_3:
    insn->opcodeType = THREEBYTE_3A;
    break;
  case TYPE_EVEX:
    switch(insn->vectorExtensionPrefix[1] & 3) {
    case 0:
      return -1;
    case 1:
      goto switchD_001a46cd_caseD_1;
    case 2:
switchD_001a46cd_caseD_2:
      insn->opcodeType = THREEBYTE_38;
      break;
    case 3:
      goto switchD_001a46cd_caseD_3;
    }
    break;
  case TYPE_XOP:
    bVar7 = insn->vectorExtensionPrefix[1] & 0x1f;
    if (bVar7 == 10) {
      insn->opcodeType = XOPA_MAP;
    }
    else if (bVar7 == 9) {
      insn->opcodeType = XOP9_MAP;
    }
    else {
      if (bVar7 != 8) {
        return -1;
      }
      insn->opcodeType = XOP8_MAP;
    }
    break;
  default:
    iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_56,insn->readerCursor);
    if (iVar8 != 0) {
      return -1;
    }
    uVar18 = insn->readerCursor + 1;
    insn->readerCursor = uVar18;
    insn->firstByte = local_56;
    if (local_56 == 0xf) {
      insn->twoByteEscape = '\x0f';
      iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_56,uVar18);
      if (iVar8 != 0) {
        return -1;
      }
      uVar18 = insn->readerCursor + 1;
      insn->readerCursor = uVar18;
      if (local_56 < 0x38) {
        if (local_56 == 0xe) {
          insn->opcodeType = T3DNOW_MAP;
          insn->consumedModRM = true;
        }
        else {
          if (local_56 != 0xf) goto LAB_001a5055;
          iVar8 = readModRM(insn);
          if (iVar8 != 0) {
            return -1;
          }
          iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_56,insn->readerCursor);
          if (iVar8 != 0) {
            return -1;
          }
          insn->readerCursor = insn->readerCursor + 1;
          insn->opcodeType = T3DNOW_MAP;
        }
      }
      else if (local_56 == 0x3a) {
        insn->threeByteEscape = ':';
        iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_56,uVar18);
        if (iVar8 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor + 1;
        insn->opcodeType = THREEBYTE_3A;
      }
      else if (local_56 == 0x38) {
        insn->threeByteEscape = '8';
        iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&local_56,uVar18);
        if (iVar8 != 0) {
          return -1;
        }
        insn->readerCursor = insn->readerCursor + 1;
        insn->opcodeType = THREEBYTE_38;
      }
      else {
LAB_001a5055:
        insn->opcodeType = TWOBYTE;
      }
    }
    insn->opcode = local_56;
    goto LAB_001a4ab2;
  }
  iVar8 = (*insn->reader)((reader_info *)insn->readerArg,&insn->opcode,insn->readerCursor);
  if (iVar8 != 0) {
    return -1;
  }
  insn->readerCursor = insn->readerCursor + 1;
LAB_001a4ab2:
  VVar2 = insn->vectorExtensionType;
  bVar25 = insn->mode == MODE_64BIT;
  if (VVar2 == TYPE_NO_VEX_XOP) {
    if (((insn->mode == MODE_16BIT) || (insn->isPrefix66 != true)) ||
       (insn->prefix66 != insn->necessaryPrefixLocation)) {
      uVar18 = insn->necessaryPrefixLocation;
      if ((insn->isPrefix67 == true) && (insn->prefix67 == uVar18)) {
        uVar20 = bVar25 | 0x20;
      }
      else if ((insn->isPrefixf3 == false) || (insn->prefixf3 != uVar18)) {
        if ((insn->isPrefixf2 == false) || (bVar5 = true, insn->prefixf2 != uVar18)) {
          bVar5 = false;
        }
        uVar20 = (ushort)bVar25;
        if (bVar5) {
          uVar20 = bVar25 | 4;
        }
      }
      else {
        uVar20 = bVar25 | 2;
      }
    }
    else {
      uVar20 = bVar25 | 0x10;
    }
  }
  else {
    uVar20 = 0x40;
    if (VVar2 == TYPE_EVEX) {
      uVar20 = 0x100;
    }
    uVar20 = bVar25 | uVar20;
    if (VVar2 == TYPE_EVEX) {
      switch(insn->vectorExtensionPrefix[2] & 3) {
      case 1:
        uVar20 = uVar20 | 0x10;
        break;
      case 2:
        uVar20 = uVar20 | 2;
        break;
      case 3:
        uVar20 = uVar20 | 4;
      }
      bVar7 = insn->vectorExtensionPrefix[3];
      if ((char)bVar7 < '\0') {
        uVar20 = uVar20 + 0x1000;
      }
      sVar15 = (bVar7 & 0x10) * 0x200;
      sVar4 = sVar15 + 0x800;
      if ((bVar7 & 7) == 0) {
        sVar4 = sVar15;
      }
      uVar20 = (bVar7 & 0x60) << 4 | sVar4 + uVar20;
    }
    else {
      if (VVar2 == TYPE_VEX_2B) {
        bVar7 = insn->vectorExtensionPrefix[1];
        uVar14 = (ushort)bVar7;
        uVar13 = (ushort)bVar7;
        switch(bVar7 & 3) {
        case 1:
          goto switchD_001a4b7b_caseD_1;
        case 2:
          goto switchD_001a4b7b_caseD_2;
        case 3:
          goto switchD_001a4b7b_caseD_3;
        }
      }
      else if (VVar2 == TYPE_XOP) {
        bVar7 = insn->vectorExtensionPrefix[2];
        uVar14 = (ushort)bVar7;
        uVar13 = (ushort)bVar7;
        switch(bVar7 & 3) {
        case 1:
          goto switchD_001a4b7b_caseD_1;
        case 2:
          goto switchD_001a4b7b_caseD_2;
        case 3:
          goto switchD_001a4b7b_caseD_3;
        }
      }
      else {
        if (VVar2 != TYPE_VEX_3B) {
          return -1;
        }
        bVar7 = insn->vectorExtensionPrefix[2];
        uVar14 = (ushort)bVar7;
        uVar13 = (ushort)bVar7;
        switch(bVar7 & 3) {
        case 1:
switchD_001a4b7b_caseD_1:
          uVar13 = uVar14;
          uVar20 = uVar20 | 0x10;
          break;
        case 2:
switchD_001a4b7b_caseD_2:
          uVar13 = uVar14;
          uVar20 = uVar20 | 2;
          break;
        case 3:
switchD_001a4b7b_caseD_3:
          uVar13 = uVar14;
          uVar20 = uVar20 | 4;
        }
      }
      uVar20 = uVar20 | (uVar13 & 4) << 5;
    }
  }
  uVar20 = uVar20 | insn->rexPrefix & 8;
  iVar8 = getIDWithAttrMask(&local_54,insn,uVar20);
  if (iVar8 != 0) {
    return -1;
  }
  if (((insn->mode == MODE_16BIT) && (insn->opcode == 0xe3)) &&
     (x86DisassemblerInstrSpecifiers[local_54].operands == 0x9c)) {
    uVar20 = uVar20 ^ 0x20;
    iVar8 = getIDWithAttrMask(&local_54,insn,uVar20);
    if (iVar8 != 0) {
      return -1;
    }
  }
  if (insn->mode == MODE_16BIT) {
    if ((uVar20 & 0x10) == 0) goto LAB_001a4cdc;
LAB_001a4d1c:
    if (((insn->opcodeType != ONEBYTE) || (insn->opcode != 0x90)) || ((insn->rexPrefix & 1) == 0)) {
      insn->instructionID = local_54;
      uVar19 = (ulong)local_54;
      goto LAB_001a4d4f;
    }
    insn->opcode = 0x91;
    iVar8 = getIDWithAttrMask(&local_4c,insn,uVar20);
    if (iVar8 == 0) {
      local_54 = local_4c;
    }
    insn->opcode = 0x90;
    insn->instructionID = local_54;
    insn->spec = x86DisassemblerInstrSpecifiers + local_54;
  }
  else {
    if (((uVar20 & 0x10) != 0) || (insn->isPrefix66 == false)) goto LAB_001a4d1c;
LAB_001a4cdc:
    iVar8 = getIDWithAttrMask(&local_4a,insn,uVar20 | 0x10);
    if ((iVar8 == 0) &&
       ((x86_16_bit_eq_lookup[local_54] != 0 &&
        (uVar9 = x86_16_bit_eq_lookup[local_54] - 1, uVar12 = (ulong)uVar9, uVar9 < 0x381)))) {
      uVar19 = (ulong)local_4a;
      do {
        if (x86_16_bit_eq_tbl[uVar12].first != local_54) break;
        if (x86_16_bit_eq_tbl[uVar12].second == local_4a) {
          if (insn->isPrefix66 != (insn->mode == MODE_16BIT)) {
            insn->instructionID = local_4a;
            goto LAB_001a4d4f;
          }
          break;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != 0x381);
    }
    insn->instructionID = local_54;
    uVar19 = (ulong)local_54;
LAB_001a4d4f:
    insn->spec = x86DisassemblerInstrSpecifiers + uVar19;
  }
  uVar20 = insn->instructionID;
  iVar8 = -1;
  if (uVar20 == 0) {
    return -1;
  }
  if (insn->isPrefixf0 != true) {
    if ((insn->isPrefixf2 == true) && (insn->twoByteEscape == '\x0f')) {
      insn->prefix0 = '\0';
    }
    goto LAB_001a50ed;
  }
  uVar9 = (uint)uVar20;
  if (uVar20 < 0x380) {
    if (uVar20 < 0x133) {
      if (((uVar20 - 0x21 < 0x35) &&
          ((0x1c01c0181c0e07U >> ((ulong)(uVar20 - 0x21) & 0x3f) & 1) != 0)) ||
         ((uVar20 - 0xac < 0x1d && ((0x181c0e07U >> (uVar20 - 0xac & 0x1f) & 1) != 0))))
      goto LAB_001a50ed;
      uVar9 = uVar9 - 0x5f;
      if (0xd < uVar9) {
        return -1;
      }
      uVar16 = 0x3007;
    }
    else {
      if (((uVar20 - 0x133 < 0x22) && ((0x333333333U >> ((ulong)(uVar20 - 0x133) & 0x3f) & 1) != 0))
         || ((uVar20 - 0x23a < 9 && ((0x1abU >> (uVar20 - 0x23a & 0x1f) & 1) != 0))))
      goto LAB_001a50ed;
      uVar9 = uVar9 - 0x28e;
      if (0xc < uVar9) {
        return -1;
      }
      uVar16 = 0x1551;
    }
  }
  else if (uVar9 == 0x9cf || uVar20 < 0x9cf) {
    if (((uVar20 - 0x70e < 0x3e) &&
        ((0x3c0e550000000055U >> ((ulong)(uVar20 - 0x70e) & 0x3f) & 1) != 0)) ||
       ((uVar20 - 0x380 < 0xd && ((0x1551U >> (uVar20 - 0x380 & 0x1f) & 1) != 0))))
    goto LAB_001a50ed;
    uVar9 = uVar9 - 0x752;
    if (10 < uVar9) {
      return -1;
    }
    uVar16 = 0x607;
  }
  else {
    if (((uVar20 - 0x1829 < 0x3d) &&
        ((0x181c0e0700148855U >> ((ulong)(uVar20 - 0x1829) & 0x3f) & 1) != 0)) ||
       ((uVar20 - 0x9d0 < 0x1d && ((0x181c0e07U >> (uVar20 - 0x9d0 & 0x1f) & 1) != 0))))
    goto LAB_001a50ed;
    uVar9 = uVar9 - 0xad3;
    if (0x1c < uVar9) {
      return -1;
    }
    uVar16 = 0x181c0e07;
  }
  if ((uVar16 >> (uVar9 & 0x1f) & 1) == 0) {
    return -1;
  }
LAB_001a50ed:
  iVar10 = readOperands(insn);
  if ((iVar10 == 0) &&
     (uVar12 = insn->readerCursor - insn->startLocation, insn->length = uVar12, uVar12 < 0x10)) {
    if (insn->operandSize == '\0') {
      insn->operandSize = insn->registerSize;
    }
    insn->operands = x86OperandSets[insn->spec->operands];
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int decodeInstruction(struct InternalInstruction *insn,
		byteReader_t reader,
		const void *readerArg,
		uint64_t startLoc,
		DisassemblerMode mode)
{
	insn->reader = reader;
	insn->readerArg = readerArg;
	insn->startLocation = startLoc;
	insn->readerCursor = startLoc;
	insn->mode = mode;

	if (readPrefixes(insn)       ||
			readOpcode(insn)         ||
			getID(insn)      ||
			insn->instructionID == 0 ||
			checkPrefix(insn) ||
			readOperands(insn))
		return -1;

	insn->length = (size_t)(insn->readerCursor - insn->startLocation);

	// instruction length must be <= 15 to be valid
	if (insn->length > 15)
		return -1;

	if (insn->operandSize == 0)
		insn->operandSize = insn->registerSize;

	insn->operands = &x86OperandSets[insn->spec->operands][0];

	// dbgprintf(insn, "Read from 0x%llx to 0x%llx: length %zu",
	// 		startLoc, insn->readerCursor, insn->length);

	//if (insn->length > 15)
	//	dbgprintf(insn, "Instruction exceeds 15-byte limit");

#if 0
	printf("\n>>> x86OperandSets = %lu\n", sizeof(x86OperandSets));
	printf(">>> x86DisassemblerInstrSpecifiers = %lu\n", sizeof(x86DisassemblerInstrSpecifiers));
	printf(">>> x86DisassemblerContexts = %lu\n", sizeof(x86DisassemblerContexts));
	printf(">>> modRMTable = %lu\n", sizeof(modRMTable));
	printf(">>> x86DisassemblerOneByteOpcodes = %lu\n", sizeof(x86DisassemblerOneByteOpcodes));
	printf(">>> x86DisassemblerTwoByteOpcodes = %lu\n", sizeof(x86DisassemblerTwoByteOpcodes));
	printf(">>> x86DisassemblerThreeByte38Opcodes = %lu\n", sizeof(x86DisassemblerThreeByte38Opcodes));
	printf(">>> x86DisassemblerThreeByte3AOpcodes = %lu\n", sizeof(x86DisassemblerThreeByte3AOpcodes));
	printf(">>> x86DisassemblerThreeByteA6Opcodes = %lu\n", sizeof(x86DisassemblerThreeByteA6Opcodes));
	printf(">>> x86DisassemblerThreeByteA7Opcodes= %lu\n", sizeof(x86DisassemblerThreeByteA7Opcodes));
	printf(">>> x86DisassemblerXOP8Opcodes = %lu\n", sizeof(x86DisassemblerXOP8Opcodes));
	printf(">>> x86DisassemblerXOP9Opcodes = %lu\n", sizeof(x86DisassemblerXOP9Opcodes));
	printf(">>> x86DisassemblerXOPAOpcodes = %lu\n\n", sizeof(x86DisassemblerXOPAOpcodes));
#endif

	return 0;
}